

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O2

Vec_Int_t * Sbc_ManDetectMult(Gia_Man_t *p,Vec_Int_t *vIns)

{
  word wVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Mem_t *p_01;
  Vec_Wrd_t *pVVar3;
  Gia_Obj_t *pGVar4;
  word *pwVar5;
  word *pwVar6;
  int *piVar7;
  word *pwVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Vec_Int_t *pVVar12;
  ulong uVar13;
  word *pwVar14;
  long lVar15;
  Vec_Mem_t *vTtMem;
  word B [64];
  word R [128];
  word A [64];
  
  pVVar12 = vIns;
  p_00 = Vec_IntStartFull(p->nObjs);
  iVar11 = vIns->nSize / 2;
  p_01 = Vec_MemAlloc(1,(int)pVVar12);
  vTtMem = p_01;
  Vec_MemHashAlloc(p_01,1000);
  pwVar6 = A;
  Sbc_SimMult(pwVar6,B,R,iVar11);
  uVar9 = iVar11 * 2;
  lVar15 = 0;
  uVar13 = 0;
  if (0 < (int)uVar9) {
    uVar13 = (ulong)uVar9;
  }
  for (; uVar13 * 8 != lVar15; lVar15 = lVar15 + 8) {
    Vec_MemHashInsert(p_01,(word *)((long)R + lVar15));
  }
  if (p_01->nEntries != uVar9) {
    __assert_fail("Vec_MemEntryNum(vTtMem) == 2*nIns",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x16e,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  Vec_WrdFreeP(&p->vSims);
  pVVar3 = Vec_WrdStart(p->nObjs);
  p->vSims = pVVar3;
  p->nSimWords = 1;
  Gia_ManIncrementTravId(p);
  if (p->nTravIdsAlloc < 1) {
    __assert_fail("Id < p->nTravIdsAlloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                  ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
  }
  *p->pTravIds = p->nTravIds;
  for (iVar10 = 0; iVar10 < p->vCis->nSize; iVar10 = iVar10 + 1) {
    iVar2 = Vec_IntEntry(p->vCis,iVar10);
    pGVar4 = Gia_ManObj(p,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ObjSetTravIdCurrent(p,pGVar4);
  }
  uVar9 = vIns->nSize;
  if ((uVar9 & 1) != 0) {
    __assert_fail("Vec_IntSize(vIns) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                  ,0x17f,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
  }
  pwVar14 = B + -(long)iVar11;
  for (lVar15 = 0; lVar15 < (int)uVar9; lVar15 = lVar15 + 1) {
    iVar10 = Vec_IntEntry(vIns,(int)lVar15);
    pGVar4 = Gia_ManObj(p,iVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    Gia_ObjSetTravIdCurrent(p,pGVar4);
    iVar10 = Gia_ObjId(p,pGVar4);
    pwVar5 = Wlc_ObjSim(p,iVar10);
    pwVar8 = pwVar14;
    if (lVar15 < iVar11) {
      pwVar8 = pwVar6;
    }
    *pwVar5 = *pwVar8;
    uVar9 = vIns->nSize;
    pwVar6 = pwVar6 + 1;
    pwVar14 = pwVar14 + 1;
  }
  for (iVar11 = 1; iVar11 < p->nObjs; iVar11 = iVar11 + 1) {
    pGVar4 = Gia_ManObj(p,iVar11);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar10 = Gia_ObjId(p,pGVar4);
    if (p->nTravIdsAlloc <= iVar10) {
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    piVar7 = p->pTravIds;
    iVar10 = Gia_ObjId(p,pGVar4);
    if (piVar7[iVar10] != p->nTravIds) {
      iVar10 = (int)*(ulong *)pGVar4;
      uVar13 = *(ulong *)pGVar4 & 0x1fffffff;
      if (uVar13 == 0x1fffffff || iVar10 < 0) {
        if ((-1 < iVar10) || ((int)uVar13 == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                        ,0x191,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
        }
        Wlc_ObjSimCo(p,iVar11);
      }
      else {
        Wlc_ObjSimAnd(p,iVar11);
      }
      pwVar6 = Wlc_ObjSim(p,iVar11);
      piVar7 = Vec_MemHashLookup(p_01,pwVar6);
      iVar10 = *piVar7;
      if (iVar10 < 0) {
        wVar1 = *pwVar6;
        Abc_TtNot(pwVar6,1);
        piVar7 = Vec_MemHashLookup(p_01,pwVar6);
        iVar10 = *piVar7;
        Abc_TtNot(pwVar6,1);
        if (wVar1 != *pwVar6) {
          __assert_fail("Temp == *pInfoObj",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                        ,0x1a1,"Vec_Int_t *Sbc_ManDetectMult(Gia_Man_t *, Vec_Int_t *)");
        }
        if (iVar10 < 0) goto LAB_00300bba;
        iVar2 = 1;
      }
      else {
        iVar2 = 0;
      }
      iVar10 = Abc_Var2Lit(iVar10,iVar2);
      Vec_IntWriteEntry(p_00,iVar11,iVar10);
    }
LAB_00300bba:
  }
  for (iVar11 = 0; iVar11 < p->vCos->nSize; iVar11 = iVar11 + 1) {
    iVar10 = Vec_IntEntry(p->vCos,iVar11);
    pGVar4 = Gia_ManObj(p,iVar10);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iVar10 = Gia_ObjId(p,pGVar4);
    Wlc_ObjSim(p,iVar10);
  }
  Vec_MemHashFree(p_01);
  Vec_MemFreeP(&vTtMem);
  return p_00;
}

Assistant:

Vec_Int_t * Sbc_ManDetectMult( Gia_Man_t * p, Vec_Int_t * vIns )
{
    int nWords = 1;
    Vec_Int_t * vGia2Out = Vec_IntStartFull( Gia_ManObjNum(p) );
    Gia_Obj_t * pObj; int i, Entry, nIns = Vec_IntSize(vIns)/2;
    word A[64], B[64], R[128], * pInfoObj; word Temp;

    // create hash table
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 1000 );
    Sbc_SimMult( A, B, R, nIns );
    for ( i = 0; i < 2*nIns; i++ )
    {
        Vec_MemHashInsert( vTtMem, R+i );
        //printf( "Out %2d : ", i );
        //Extra_PrintHex( stdout, (unsigned *)(R+i), 6 ); printf( "\n" );
    }
    assert( Vec_MemEntryNum(vTtMem) == 2*nIns );

    // alloc simulation info
    Vec_WrdFreeP( &p->vSims );
    p->vSims = Vec_WrdStart( Gia_ManObjNum(p) * nWords );
    p->nSimWords = nWords;

    // mark inputs
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrentId( p, 0 );
    Gia_ManForEachCi( p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        //Wlc_ObjSimPi( p, Gia_ObjId(p, pObj) );
    }

    // assign inputs
    assert( Vec_IntSize(vIns) % 2 == 0 );
    Gia_ManForEachObjVec( vIns, p, pObj, i )
    {
        Gia_ObjSetTravIdCurrent( p, pObj );
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        *pInfoObj = i < nIns ? A[i] : B[i - nIns];
    }

    // perform simulation
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsTravIdCurrent(p, pObj) )
            continue;

        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( p, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( p, i );
        else assert( 0 );

        // mark direct polarity
        pInfoObj = Wlc_ObjSim( p, i );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 0) );
            continue;
        }

        // mark negated polarity
        Temp = *pInfoObj;
        Abc_TtNot( pInfoObj, nWords );
        Entry = *Vec_MemHashLookup( vTtMem, pInfoObj );
        Abc_TtNot( pInfoObj, nWords );
        assert( Temp == *pInfoObj );
        if ( Entry >= 0 )
        {
            Vec_IntWriteEntry( vGia2Out, i, Abc_Var2Lit(Entry, 1) );
            continue;
        }
    }

    Gia_ManForEachCo( p, pObj, i )
    {
        pInfoObj = Wlc_ObjSim( p, Gia_ObjId(p, pObj) );
        //printf( "Out %2d : Driver = %5d(%d)", i, Gia_ObjFaninId0p(p, pObj), Gia_ObjFaninC0(pObj) );
        //Extra_PrintHex( stdout, (unsigned *)pInfoObj, 6 ); printf( "\n" );
    }

    // cleanup
    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );
    //Vec_WrdFreeP( &p->vSims );
    //p->nSimWords = 0;
    return vGia2Out;
}